

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O2

int Mvc_CoverBestLiteral(Mvc_Cover_t *pCover,Mvc_Cube_t *pMask)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  Mvc_Cube_t *pMVar6;
  int iVar7;
  
  uVar5 = 0;
  uVar1 = pCover->nBits;
  if (pCover->nBits < 1) {
    uVar1 = 0;
  }
  uVar3 = 0xffffffff;
  iVar2 = -1;
  while( true ) {
    uVar4 = (uint)uVar5;
    if (uVar4 == uVar1) break;
    if ((pMask == (Mvc_Cube_t *)0x0) || ((pMask->pData[uVar5 >> 5] >> (uVar4 & 0x1f) & 1) != 0)) {
      iVar7 = 0;
      pMVar6 = (Mvc_Cube_t *)&pCover->lCubes;
      while (pMVar6 = pMVar6->pNext, pMVar6 != (Mvc_Cube_t *)0x0) {
        iVar7 = iVar7 + (uint)((pMVar6->pData[uVar5 >> 5] >> (uVar4 & 0x1f) & 1) != 0);
      }
      if (iVar2 < iVar7) {
        uVar3 = uVar5;
      }
      if (iVar2 <= iVar7) {
        iVar2 = iVar7;
      }
    }
    uVar5 = (ulong)(uVar4 + 1);
  }
  iVar7 = -1;
  if (1 < iVar2) {
    iVar7 = (int)uVar3;
  }
  return iVar7;
}

Assistant:

int Mvc_CoverBestLiteral( Mvc_Cover_t * pCover, Mvc_Cube_t * pMask )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit;
    int i, iMax, nLitsMax, nLitsCur;
    int fUseFirst = 1;

    // go through each literal
    iMax = -1;
    nLitsMax = -1;
    for ( i = 0; i < pCover->nBits; i++ )
        if ( !pMask || Mvc_CubeBitValue(pMask,i) )
        {
            // get the word and bit of this literal
            nWord = Mvc_CubeWhichWord(i);
            nBit  = Mvc_CubeWhichBit(i);
            // go through all the cubes
            nLitsCur = 0;
            Mvc_CoverForEachCube( pCover, pCube )
                if ( pCube->pData[nWord] & (1<<nBit) )
                    nLitsCur++;

            // check if this is the best literal
            if ( fUseFirst )
            {
                if ( nLitsMax < nLitsCur )
                {
                    nLitsMax = nLitsCur;
                    iMax = i;
                }
            }
            else
            {
                if ( nLitsMax <= nLitsCur )
                {
                    nLitsMax = nLitsCur;
                    iMax = i;
                }
            }
        }

    if ( nLitsMax > 1 )
        return iMax;
    return -1;
}